

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointActionDiscrete.cpp
# Opt level: O1

void __thiscall JointActionDiscrete::~JointActionDiscrete(JointActionDiscrete *this)

{
  pointer *this_00;
  
  this_00 = &this[-1]._m_apVector.
             super__Vector_base<const_ActionDiscrete_*,_std::allocator<const_ActionDiscrete_*>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  ~JointActionDiscrete((JointActionDiscrete *)this_00);
  operator_delete(this_00,0x48);
  return;
}

Assistant:

JointActionDiscrete::~JointActionDiscrete()
{
if(DEBUG_JAD) cout << "deleting joint action";

/*  Do not delete the individual actions that are pointed to (there is only
 *  one copy of those, so that will lead to segfaults)
    for(Index i=0; i<_m_apVector.size(); i++) 
        delete _m_apVector[i];*/

    _m_apVector.clear();
}